

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

OneofDescriptor * __thiscall
google::protobuf::Descriptor::FindOneofByName(Descriptor *this,string *key)

{
  anon_union_8_8_13f84498_for_Symbol_2 aVar1;
  Symbol SVar2;
  
  SVar2 = FileDescriptorTables::FindNestedSymbolOfType
                    (*(FileDescriptorTables **)(*(long *)(this + 0x10) + 0x90),this,key,ONEOF);
  aVar1.descriptor = (Descriptor *)0x0;
  if (SVar2.type != NULL_SYMBOL) {
    aVar1 = SVar2.field_1;
  }
  return (OneofDescriptor *)aVar1.descriptor;
}

Assistant:

const OneofDescriptor* Descriptor::FindOneofByName(
    const std::string& key) const {
  Symbol result =
      file()->tables_->FindNestedSymbolOfType(this, key, Symbol::ONEOF);
  if (!result.IsNull()) {
    return result.oneof_descriptor;
  } else {
    return nullptr;
  }
}